

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

void NodeContext_Done(nodecontext *p)

{
  nodemodule *p_00;
  void *pvVar1;
  char *pcVar2;
  
  NodeSingletonEvent(p,10,(nodemodule *)0x0);
  NodeContext_Cleanup(p,1);
  UnRegisterModule(p,&p->Base,1);
  while (p_00 = (p->Base).Next, p_00 != (nodemodule *)0x0) {
    (p->Base).Next = p_00->Next;
    Node_Release(p_00);
  }
  Node_Destructor((node *)p);
  if ((p->Base).Base.RefCount == 1) {
    if (7 < (p->NodeClass)._Used) {
      pcVar2 = (p->NodeClass)._Begin;
      do {
        pvVar1 = *(void **)pcVar2;
        if ((((*(long *)((long)pvVar1 + 8) != 0) || (*(long *)((long)pvVar1 + 0x20) != 0)) ||
            (*(long *)((long)pvVar1 + 0x28) != 0)) || (*(long *)((long)pvVar1 + 0x30) != 0)) {
          __assert_fail("!(*i)->Meta && !(*i)->MetaGet && !(*i)->MetaSet && !(*i)->MetaUnSet",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0xa73,"void NodeContext_Done(nodecontext *)");
        }
        (*p->NodeHeap->Free)(p->NodeHeap,pvVar1,*(long *)((long)pvVar1 + 0x40) + 0x48);
        pcVar2 = pcVar2 + 8;
      } while (pcVar2 != (p->NodeClass)._Begin + ((p->NodeClass)._Used & 0xfffffffffffffff8));
    }
    if ((p->Collect)._Used == 0) {
      ArrayClear(&p->Collect);
      ArrayClear(&p->NodeSingleton);
      ArrayClear(&p->NodeClass);
      return;
    }
    __assert_fail("ARRAYEMPTY(p->Collect)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0xa77,"void NodeContext_Done(nodecontext *)");
  }
  __assert_fail("p->Base.Base.RefCount==1",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0xa6e,"void NodeContext_Done(nodecontext *)");
}

Assistant:

void NodeContext_Done(nodecontext* p)
{
    nodeclass **i;

    NodeSingletonEvent(p,NODE_SINGLETON_SHUTDOWN,NULL);

    NodeContext_Cleanup(p,1); // first unregister all plugins

    UnRegisterModule(p,&p->Base,1); // unregister common.dll classes

    // free modules
    while (p->Base.Next)
    {
        node* v = (node*)p->Base.Next;
        p->Base.Next = p->Base.Next->Next;
        Node_Release(v);
    }

    Node_Destructor((node*)p);

#if defined(CONFIG_DEBUG_LEAKS)
    if (p->Base.Base.RefCount!=1)
    {
        class_ref_t *Item;
        for (Item=ARRAYBEGIN(p->Base.ClassRefs,class_ref_t);Item!=ARRAYEND(p->Base.ClassRefs,class_ref_t);++Item)
        {
            DebugMessage(T("remaining class %r (%d times)"),Item->Class->FourCC,Item->Count);
        }
    }
#endif
    assert(p->Base.Base.RefCount==1); // node memory leaking?

    // free classes
    for (i=ARRAYBEGIN(p->NodeClass,nodeclass*);i!=ARRAYEND(p->NodeClass,nodeclass*);++i)
    {
        assert(!(*i)->Meta && !(*i)->MetaGet && !(*i)->MetaSet && !(*i)->MetaUnSet);
        MemHeap_Free(p->NodeHeap,*i,sizeof(nodeclass)+(*i)->VMTSize);
    }

    assert(ARRAYEMPTY(p->Collect));
    ArrayClear(&p->Collect);
    ArrayClear(&p->NodeSingleton);
    ArrayClear(&p->NodeClass);
}